

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

Instruction * __thiscall spvtools::opt::Loop::GetConditionInst(Loop *this)

{
  uint32_t id;
  BasicBlock *pBVar1;
  DefUseManager *this_00;
  Instruction *pIVar2;
  Instruction *pIVar3;
  Function *local_20;
  
  pBVar1 = FindConditionBlock(this);
  if ((pBVar1 == (BasicBlock *)0x0) ||
     (BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffe0),
     *(Op *)&(local_20->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
             sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase
     != OpBranchConditional)) {
    pIVar3 = (Instruction *)0x0;
  }
  else {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    id = Instruction::GetSingleWordInOperand((Instruction *)local_20,0);
    pIVar2 = analysis::DefUseManager::GetDef(this_00,id);
    pIVar3 = (Instruction *)0x0;
    if (pIVar2->opcode_ - OpUGreaterThan < 8) {
      pIVar3 = pIVar2;
    }
  }
  return pIVar3;
}

Assistant:

Instruction* Loop::GetConditionInst() const {
  BasicBlock* condition_block = FindConditionBlock();
  if (!condition_block) {
    return nullptr;
  }
  Instruction* branch_conditional = &*condition_block->tail();
  if (!branch_conditional ||
      branch_conditional->opcode() != spv::Op::OpBranchConditional) {
    return nullptr;
  }
  Instruction* condition_inst = context_->get_def_use_mgr()->GetDef(
      branch_conditional->GetSingleWordInOperand(0));
  if (IsSupportedCondition(condition_inst->opcode())) {
    return condition_inst;
  }

  return nullptr;
}